

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O0

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall DisconnectedBlockTransactions::LimitMemoryUsage(DisconnectedBlockTransactions *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  long *in_RSI;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *evicted;
  CTransaction *in_stack_ffffffffffffff78;
  key_type *in_stack_ffffffffffffff80;
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  *in_stack_ffffffffffffff88;
  shared_ptr<const_CTransaction> *in_stack_ffffffffffffff90;
  DisconnectedBlockTransactions *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar3 = std::__cxx11::
            list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_ffffffffffffff78);
    bVar2 = false;
    if (!bVar3) {
      sVar4 = DynamicMemoryUsage(in_stack_ffffffffffffff98);
      bVar2 = (ulong)in_RSI[1] < sVar4;
    }
    if (!bVar2) break;
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::front((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffff80);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&>
              ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::front((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffff80);
    sVar4 = RecursiveDynamicUsage<CTransaction_const>
                      ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff88);
    *in_RSI = *in_RSI - sVar4;
    in_stack_ffffffffffffff90 = (shared_ptr<const_CTransaction> *)(in_RSI + 5);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::front((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffff80);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff98 =
         (DisconnectedBlockTransactions *)CTransaction::GetHash(in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff88 =
         (unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
          *)transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<false> *)in_stack_ffffffffffffff78);
    std::
    unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
    ::erase(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::pop_front((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<CTransactionRef> DisconnectedBlockTransactions::LimitMemoryUsage()
{
    std::vector<CTransactionRef> evicted;

    while (!queuedTx.empty() && DynamicMemoryUsage() > m_max_mem_usage) {
        evicted.emplace_back(queuedTx.front());
        cachedInnerUsage -= RecursiveDynamicUsage(queuedTx.front());
        iters_by_txid.erase(queuedTx.front()->GetHash());
        queuedTx.pop_front();
    }
    return evicted;
}